

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache_p.h
# Opt level: O2

void __thiscall QCacheItem::reset(QCacheItem *this)

{
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> QVar1;
  long in_FS_OFFSET;
  QNetworkCacheMetaData local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QNetworkCacheMetaData::QNetworkCacheMetaData(&local_20);
  QVar1.d.ptr = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)(this->metaData).d.d.ptr;
  (this->metaData).d.d.ptr = (QNetworkCacheMetaDataPrivate *)local_20.d.d.ptr;
  local_20.d.d.ptr =
       (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)
       (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)QVar1.d.ptr;
  QNetworkCacheMetaData::~QNetworkCacheMetaData(&local_20);
  QBuffer::close();
  if (this->file != (QSaveFile *)0x0) {
    (**(code **)(*(long *)this->file + 0x20))();
  }
  this->file = (QSaveFile *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void reset() {
        metaData = QNetworkCacheMetaData();
        data.close();
        delete file;
        file = nullptr;
    }